

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O2

void JsToString(JsValue *val,JsValue *res)

{
  double dVar1;
  undefined4 uVar2;
  char *pcVar3;
  undefined1 local_40 [8];
  JsValue prim;
  
  res->type = JS_STRING;
  switch(val->type) {
  case JS_UNDEFINED:
    pcVar3 = "undefined";
    break;
  case JS_NULL:
    pcVar3 = "null";
    break;
  case JS_BOOLEAN:
    if ((val->u).boolean == 1) {
      pcVar3 = "true";
    }
    else {
      pcVar3 = "false";
    }
    break;
  case JS_NUMBER:
    prim.u.reference.name = (char *)(val->u).number;
    pcVar3 = (char *)JsMalloc(0x80);
    if (((double)prim.u.reference.name != (double)(int)prim.u._8_8_) ||
       (NAN((double)prim.u.reference.name) || NAN((double)(int)prim.u._8_8_))) {
      sprintf(pcVar3,"%f");
    }
    else {
      sprintf(pcVar3,"%d",(ulong)(uint)(int)(double)prim.u.reference.name);
    }
    (res->u).string = pcVar3;
    return;
  case JS_STRING:
    (res->u).reference.name = (val->u).reference.name;
    uVar2 = *(undefined4 *)&val->field_0x4;
    dVar1 = (val->u).number;
    res->type = val->type;
    *(undefined4 *)&res->field_0x4 = uVar2;
    (res->u).number = dVar1;
    return;
  case JS_OBJECT:
    JsToPrimitive(val,0,(JsValue *)local_40);
    JsToString((JsValue *)local_40,res);
    return;
  default:
    JsThrowString("JsToStringError");
    return;
  }
  (res->u).number = (double)pcVar3;
  return;
}

Assistant:

void JsToString(struct JsValue *val, struct JsValue *res){
	
	res->type = JS_STRING;
	switch (val->type) {
	case JS_UNDEFINED:
		res->u.string = "undefined";
		break;
	case JS_NULL:
		res->u.string = "null";
		break;
	case JS_BOOLEAN:{
		if(val->u.boolean == TRUE)
			res->u.string ="true";
		else
			res->u.string = "false";
		break;
	}
	case JS_NUMBER:{					 /* 9.8.1 */
		char* buf;
		double value ;
		value = val->u.number;
		//最大长度为128位
		buf = (char*)JsMalloc(128);
		if(value - (int)value == 0){
			//整数
			sprintf(buf,"%d",(int)value);
		}else{
			sprintf(buf,"%f",value);
		}
		res->u.string = buf;
		break;
	}
	case JS_STRING:
		*res = *val;
		break;
	case JS_OBJECT:{
		struct JsValue prim;
		JsToPrimitive(val,JS_OBJECT_HIT_TYPE_STRING, &prim);
		JsToString(&prim, res);
		break;
	}
	default:
		JsThrowString("JsToStringError");
		
	}

}